

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  float *pfVar22;
  float *pfVar23;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  __m128 _D_1;
  __m128 _rows1_1;
  __m128 _rows0_1;
  __m128 _b1_128;
  __m128 _b0_128;
  __m256 _D;
  __m256 _rows1;
  __m256 _rows0;
  __m256 _b1_256;
  __m256 _b0_256;
  int dx;
  float *Dp;
  float *rows1p;
  float *rows0p;
  float b1;
  float b0;
  float a1_1;
  float a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_2;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  float a1;
  float a0;
  float *S1p;
  int sx;
  int dx_1;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff7d0;
  size_t in_stack_fffffffffffff7d8;
  undefined8 in_stack_fffffffffffff7e0;
  int iVar27;
  float **ppfVar26;
  Mat *in_stack_fffffffffffff7e8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  int local_5e4;
  float *local_5e0;
  float *local_5d8;
  float *local_5d0;
  int local_5a4;
  float *local_590;
  int local_564;
  float *local_558;
  int local_538;
  int local_534;
  float *local_530;
  float *local_528;
  float *local_510;
  int *local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  long *local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined8 local_4d0;
  float *local_4c8;
  int *local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  long *local_4a8;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined8 local_488;
  int local_480;
  int local_47c;
  long local_478;
  float *local_470;
  long local_468;
  float *local_460;
  long *local_458;
  long *local_450;
  float **local_448;
  float **local_438;
  int local_424;
  long *local_420;
  int local_414;
  long *local_410;
  int local_404;
  long *local_400;
  int local_3f4;
  long *local_3f0;
  float local_3e8;
  float local_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2d4;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float *local_208;
  int local_1f0;
  undefined4 local_1ec;
  float **local_1e8;
  int local_1d0;
  undefined4 local_1cc;
  float **local_1c8;
  float *local_1c0;
  float *local_1b0;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float *local_188;
  undefined1 local_180 [32];
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined1 local_140 [32];
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float **local_a0;
  float **local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  float **local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_5c;
  float **local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  iVar27 = (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
  local_47c = *(int *)((long)in_RSI + 0x2c);
  local_480 = (int)in_RSI[6];
  local_78 = &local_4c8;
  local_88 = 4;
  local_90 = 0;
  local_4c8 = (float *)0x0;
  local_4c0 = (int *)0x0;
  local_4b8 = 0;
  local_4b0 = 0;
  local_4a8 = (long *)0x0;
  local_4a0 = 0;
  local_49c = 0;
  local_498 = 0;
  local_494 = 0;
  local_490 = 0;
  local_488 = 0;
  local_478 = in_R9;
  local_470 = in_R8;
  local_468 = in_RCX;
  local_460 = in_RDX;
  local_458 = in_RSI;
  local_450 = in_RDI;
  local_7c = local_47c;
  Mat::create(in_stack_fffffffffffff7e8,iVar27,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  local_58 = &local_510;
  local_5c = local_47c;
  local_68 = 4;
  local_70 = 0;
  local_510 = (float *)0x0;
  local_508 = (int *)0x0;
  local_500 = 0;
  local_4f8 = 0;
  local_4f0 = (long *)0x0;
  local_4e8 = 0;
  local_4e4 = 0;
  local_4e0 = 0;
  local_4dc = 0;
  local_4d8 = 0;
  local_4d0 = 0;
  Mat::create(in_stack_fffffffffffff7e8,iVar27,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  local_98 = &local_4c8;
  local_528 = local_4c8;
  local_a0 = &local_510;
  local_530 = local_510;
  local_534 = -2;
  for (local_538 = 0; pfVar23 = local_528, local_538 < local_480; local_538 = local_538 + 1) {
    iVar27 = *(int *)(local_478 + (long)local_538 * 4);
    if (iVar27 != local_534) {
      if (iVar27 == local_534 + 1) {
        local_528 = local_530;
        local_530 = pfVar23;
        local_404 = iVar27 + 1;
        local_400 = local_450;
        lVar6 = *local_450;
        iVar3 = *(int *)((long)local_450 + 0x2c);
        lVar7 = local_450[2];
        local_558 = local_460;
        for (local_564 = 0; local_564 < local_47c; local_564 = local_564 + 1) {
          pfVar22 = (float *)(lVar6 + (long)iVar3 * (long)local_404 * lVar7 +
                             (long)*(int *)(local_468 + (long)local_564 * 4) * 4);
          pfVar23[local_564] = *pfVar22 * *local_558 + pfVar22[1] * local_558[1];
          local_558 = local_558 + 2;
        }
      }
      else {
        local_410 = local_450;
        lVar6 = *local_450;
        iVar3 = *(int *)((long)local_450 + 0x2c);
        lVar7 = local_450[2];
        local_424 = iVar27 + 1;
        local_420 = local_450;
        lVar8 = *local_450;
        iVar4 = *(int *)((long)local_450 + 0x2c);
        lVar9 = local_450[2];
        local_590 = local_460;
        for (local_5a4 = 0; local_414 = iVar27, local_5a4 < local_47c; local_5a4 = local_5a4 + 1) {
          iVar5 = *(int *)(local_468 + (long)local_5a4 * 4);
          pfVar23 = (float *)(lVar6 + (long)iVar3 * (long)iVar27 * lVar7 + (long)iVar5 * 4);
          pfVar22 = (float *)(lVar8 + (long)iVar4 * (long)local_424 * lVar9 + (long)iVar5 * 4);
          fVar1 = *local_590;
          fVar2 = local_590[1];
          local_528[local_5a4] = *pfVar23 * fVar1 + pfVar23[1] * fVar2;
          local_530[local_5a4] = *pfVar22 * fVar1 + pfVar22[1] * fVar2;
          local_590 = local_590 + 2;
        }
      }
    }
    local_3e4 = *local_470;
    local_3e8 = local_470[1];
    local_5d0 = local_528;
    local_5d8 = local_530;
    local_3f0 = local_458;
    local_3f4 = local_538;
    local_5e0 = (float *)(*local_458 +
                         (long)*(int *)((long)local_458 + 0x2c) * (long)local_538 * local_458[2]);
    local_5e4 = 0;
    auVar10 = vinsertps_avx(ZEXT416((uint)local_3e4),ZEXT416((uint)local_3e4),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)local_3e4),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)local_3e4),0x30);
    auVar11 = vinsertps_avx(ZEXT416((uint)local_3e4),ZEXT416((uint)local_3e4),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)local_3e4),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)local_3e4),0x30);
    auVar24._16_16_ = auVar10;
    auVar24._0_16_ = auVar11;
    local_180._0_8_ = auVar11._0_8_;
    local_180._8_8_ = auVar11._8_8_;
    local_180._16_8_ = auVar10._0_8_;
    local_180._24_8_ = auVar10._8_8_;
    auVar12 = vinsertps_avx(ZEXT416((uint)local_3e8),ZEXT416((uint)local_3e8),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)local_3e8),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)local_3e8),0x30);
    auVar13 = vinsertps_avx(ZEXT416((uint)local_3e8),ZEXT416((uint)local_3e8),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)local_3e8),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)local_3e8),0x30);
    auVar25._16_16_ = auVar12;
    auVar25._0_16_ = auVar13;
    local_140._0_8_ = auVar13._0_8_;
    local_140._8_8_ = auVar13._8_8_;
    local_140._16_8_ = auVar12._0_8_;
    local_140._24_8_ = auVar12._8_8_;
    for (; local_5e4 + 7 < local_47c; local_5e4 = local_5e4 + 8) {
      local_48 = local_5d0;
      uVar14 = *(undefined8 *)local_5d0;
      uVar15 = *(undefined8 *)(local_5d0 + 2);
      uVar16 = *(undefined8 *)(local_5d0 + 4);
      uVar17 = *(undefined8 *)(local_5d0 + 6);
      local_50 = local_5d8;
      uVar18 = *(undefined8 *)local_5d8;
      uVar19 = *(undefined8 *)(local_5d8 + 2);
      uVar20 = *(undefined8 *)(local_5d8 + 4);
      uVar21 = *(undefined8 *)(local_5d8 + 6);
      local_3c0._0_4_ = (float)uVar14;
      local_3c0._4_4_ = (float)((ulong)uVar14 >> 0x20);
      uStack_3b8._0_4_ = (float)uVar15;
      uStack_3b8._4_4_ = (float)((ulong)uVar15 >> 0x20);
      uStack_3b0._0_4_ = (float)uVar16;
      uStack_3b0._4_4_ = (float)((ulong)uVar16 >> 0x20);
      uStack_3a8._0_4_ = (float)uVar17;
      uStack_3a8._4_4_ = (float)((ulong)uVar17 >> 0x20);
      local_3e0._0_4_ = auVar11._0_4_;
      local_3e0._4_4_ = auVar11._4_4_;
      uStack_3d8._0_4_ = auVar11._8_4_;
      uStack_3d8._4_4_ = auVar11._12_4_;
      uStack_3d0._0_4_ = auVar10._0_4_;
      uStack_3d0._4_4_ = auVar10._4_4_;
      uStack_3c8._0_4_ = auVar10._8_4_;
      local_6a0 = CONCAT44(local_3c0._4_4_ * local_3e0._4_4_,(float)local_3c0 * (float)local_3e0);
      uStack_698 = CONCAT44(uStack_3b8._4_4_ * uStack_3d8._4_4_,
                            (float)uStack_3b8 * (float)uStack_3d8);
      uStack_690 = CONCAT44(uStack_3b0._4_4_ * uStack_3d0._4_4_,
                            (float)uStack_3b0 * (float)uStack_3d0);
      uStack_688 = CONCAT44(uStack_3a8._4_4_,(float)uStack_3a8 * (float)uStack_3c8);
      local_380 = local_140._0_8_;
      uStack_378 = local_140._8_8_;
      uStack_370 = local_140._16_8_;
      uStack_368 = local_140._24_8_;
      local_3a0 = local_6a0;
      uStack_398 = uStack_698;
      uStack_390 = uStack_690;
      uStack_388 = uStack_688;
      local_360._0_4_ = (float)uVar18;
      local_320 = (float)local_360;
      local_360._4_4_ = (float)((ulong)uVar18 >> 0x20);
      fStack_31c = local_360._4_4_;
      uStack_358._0_4_ = (float)uVar19;
      fStack_318 = (float)uStack_358;
      uStack_358._4_4_ = (float)((ulong)uVar19 >> 0x20);
      fStack_314 = uStack_358._4_4_;
      uStack_350._0_4_ = (float)uVar20;
      fStack_310 = (float)uStack_350;
      uStack_350._4_4_ = (float)((ulong)uVar20 >> 0x20);
      fStack_30c = uStack_350._4_4_;
      uStack_348._0_4_ = (float)uVar21;
      fStack_308 = (float)uStack_348;
      uStack_348._4_4_ = (float)((ulong)uVar21 >> 0x20);
      fStack_304 = uStack_348._4_4_;
      local_340._0_4_ = auVar13._0_4_;
      local_340._4_4_ = auVar13._4_4_;
      uStack_338._0_4_ = auVar13._8_4_;
      uStack_338._4_4_ = auVar13._12_4_;
      uStack_330._0_4_ = auVar12._0_4_;
      uStack_330._4_4_ = auVar12._4_4_;
      uStack_328._0_4_ = auVar12._8_4_;
      local_e0 = (float)local_360 * (float)local_340;
      fStack_dc = local_360._4_4_ * local_340._4_4_;
      fStack_d8 = (float)uStack_358 * (float)uStack_338;
      fStack_d4 = uStack_358._4_4_ * uStack_338._4_4_;
      fStack_d0 = (float)uStack_350 * (float)uStack_330;
      fStack_cc = uStack_350._4_4_ * uStack_330._4_4_;
      fStack_c8 = (float)uStack_348 * (float)uStack_328;
      local_100 = local_6a0;
      uStack_f8 = uStack_698;
      uStack_f0 = uStack_690;
      uStack_e8 = uStack_688;
      local_240 = CONCAT44(fStack_dc + local_3c0._4_4_ * local_3e0._4_4_,
                           local_e0 + (float)local_3c0 * (float)local_3e0);
      uStack_238 = CONCAT44(fStack_d4 + uStack_3b8._4_4_ * uStack_3d8._4_4_,
                            fStack_d8 + (float)uStack_3b8 * (float)uStack_3d8);
      uStack_230 = CONCAT44(fStack_cc + uStack_3b0._4_4_ * uStack_3d0._4_4_,
                            fStack_d0 + (float)uStack_3b0 * (float)uStack_3d0);
      uStack_228 = CONCAT44(uStack_348._4_4_ + uStack_3a8._4_4_,
                            fStack_c8 + (float)uStack_3a8 * (float)uStack_3c8);
      local_208 = local_5e0;
      *(undefined8 *)local_5e0 = local_240;
      *(undefined8 *)(local_5e0 + 2) = uStack_238;
      *(undefined8 *)(local_5e0 + 4) = uStack_230;
      *(undefined8 *)(local_5e0 + 6) = uStack_228;
      local_5e0 = local_5e0 + 8;
      local_5d0 = local_5d0 + 8;
      local_5d8 = local_5d8 + 8;
      local_3e0 = local_180._0_8_;
      uStack_3d8 = local_180._8_8_;
      uStack_3d0 = local_180._16_8_;
      uStack_3c8 = local_180._24_8_;
      local_3c0 = uVar14;
      uStack_3b8 = uVar15;
      uStack_3b0 = uVar16;
      uStack_3a8 = uVar17;
      local_360 = uVar18;
      uStack_358 = uVar19;
      uStack_350 = uVar20;
      uStack_348 = uVar21;
      local_340 = local_140._0_8_;
      uStack_338 = local_140._8_8_;
      uStack_330 = local_140._16_8_;
      uStack_328 = local_140._24_8_;
      fStack_c4 = fStack_304;
    }
    for (; local_5e4 + 3 < local_47c; local_5e4 = local_5e4 + 4) {
      local_38 = local_5d0;
      uVar14 = *(undefined8 *)local_5d0;
      uVar15 = *(undefined8 *)(local_5d0 + 2);
      local_40 = local_5d8;
      local_270 = *(undefined8 *)local_5d8;
      uStack_268 = *(undefined8 *)(local_5d8 + 2);
      local_2a0._0_4_ = (float)uVar14;
      local_2a0._4_4_ = (float)((ulong)uVar14 >> 0x20);
      uStack_298._0_4_ = (float)uVar15;
      uStack_298._4_4_ = (float)((ulong)uVar15 >> 0x20);
      local_6f0 = CONCAT44(local_2a0._4_4_ * local_3e4,(float)local_2a0 * local_3e4);
      uStack_6e8 = CONCAT44(uStack_298._4_4_ * local_3e4,(float)uStack_298 * local_3e4);
      local_290 = local_6f0;
      uStack_288 = uStack_6e8;
      local_250._0_4_ = (float)local_270;
      local_250._4_4_ = (float)((ulong)local_270 >> 0x20);
      uStack_248._0_4_ = (float)uStack_268;
      uStack_248._4_4_ = (float)((ulong)uStack_268 >> 0x20);
      local_b0 = (float)local_250 * local_3e8;
      fStack_ac = local_250._4_4_ * local_3e8;
      fStack_a8 = (float)uStack_248 * local_3e8;
      fStack_a4 = uStack_248._4_4_ * local_3e8;
      local_c0 = local_6f0;
      uStack_b8 = uStack_6e8;
      local_1a0 = CONCAT44(fStack_ac + local_2a0._4_4_ * local_3e4,
                           local_b0 + (float)local_2a0 * local_3e4);
      uStack_198 = CONCAT44(fStack_a4 + uStack_298._4_4_ * local_3e4,
                            fStack_a8 + (float)uStack_298 * local_3e4);
      local_188 = local_5e0;
      *(undefined8 *)local_5e0 = local_1a0;
      *(undefined8 *)(local_5e0 + 2) = uStack_198;
      local_5e0 = local_5e0 + 4;
      local_5d0 = local_5d0 + 4;
      local_5d8 = local_5d8 + 4;
      local_2b0 = CONCAT44(local_3e4,local_3e4);
      uStack_2a8 = CONCAT44(local_3e4,local_3e4);
      local_2a0 = uVar14;
      uStack_298 = uVar15;
      local_280 = CONCAT44(local_3e8,local_3e8);
      uStack_278 = CONCAT44(local_3e8,local_3e8);
      local_260 = CONCAT44(local_3e8,local_3e8);
      uStack_258 = CONCAT44(local_3e8,local_3e8);
      local_250 = local_270;
      uStack_248 = uStack_268;
    }
    for (; local_5e4 < local_47c; local_5e4 = local_5e4 + 1) {
      *local_5e0 = *local_5d0 * local_3e4 + *local_5d8 * local_3e8;
      local_5e0 = local_5e0 + 1;
      local_5d8 = local_5d8 + 1;
      local_5d0 = local_5d0 + 1;
    }
    local_470 = local_470 + 2;
    local_534 = iVar27;
    local_2f0 = local_3e8;
    fStack_2ec = local_3e8;
    fStack_2e8 = local_3e8;
    fStack_2e4 = local_3e8;
    local_2d4 = local_3e8;
    local_2d0 = local_3e4;
    fStack_2cc = local_3e4;
    fStack_2c8 = local_3e4;
    fStack_2c4 = local_3e4;
    local_2b4 = local_3e4;
    local_180 = auVar24;
    local_160 = local_3e4;
    local_15c = local_3e4;
    local_158 = local_3e4;
    local_154 = local_3e4;
    local_150 = local_3e4;
    local_14c = local_3e4;
    local_148 = local_3e4;
    local_144 = local_3e4;
    local_140 = auVar25;
    local_120 = local_3e8;
    local_11c = local_3e8;
    local_118 = local_3e8;
    local_114 = local_3e8;
    local_110 = local_3e8;
    local_10c = local_3e8;
    local_108 = local_3e8;
    local_104 = local_3e8;
  }
  ppfVar26 = &local_510;
  local_448 = ppfVar26;
  local_1c8 = ppfVar26;
  if (local_508 != (int *)0x0) {
    local_1cc = 0xffffffff;
    LOCK();
    local_1d0 = *local_508;
    *local_508 = *local_508 + -1;
    UNLOCK();
    if (local_1d0 == 1) {
      if (local_4f0 == (long *)0x0) {
        local_1c0 = local_510;
        if (local_510 != (float *)0x0) {
          free(local_510);
        }
      }
      else {
        (**(code **)(*local_4f0 + 0x18))(local_4f0,local_510);
      }
    }
  }
  *ppfVar26 = (float *)0x0;
  ppfVar26[2] = (float *)0x0;
  *(undefined4 *)(ppfVar26 + 3) = 0;
  *(undefined4 *)(ppfVar26 + 5) = 0;
  *(undefined4 *)((long)ppfVar26 + 0x2c) = 0;
  *(undefined4 *)(ppfVar26 + 6) = 0;
  *(undefined4 *)((long)ppfVar26 + 0x34) = 0;
  *(undefined4 *)(ppfVar26 + 7) = 0;
  ppfVar26[8] = (float *)0x0;
  ppfVar26[1] = (float *)0x0;
  ppfVar26 = &local_4c8;
  if (local_4c0 != (int *)0x0) {
    local_1ec = 0xffffffff;
    LOCK();
    local_1f0 = *local_4c0;
    *local_4c0 = *local_4c0 + -1;
    UNLOCK();
    if (local_1f0 == 1) {
      local_438 = ppfVar26;
      local_1e8 = ppfVar26;
      if (local_4a8 == (long *)0x0) {
        local_1b0 = local_4c8;
        if (local_4c8 != (float *)0x0) {
          free(local_4c8);
        }
      }
      else {
        (**(code **)(*local_4a8 + 0x18))(local_4a8,local_4c8);
      }
    }
  }
  *ppfVar26 = (float *)0x0;
  ppfVar26[2] = (float *)0x0;
  *(undefined4 *)(ppfVar26 + 3) = 0;
  *(undefined4 *)(ppfVar26 + 5) = 0;
  *(undefined4 *)((long)ppfVar26 + 0x2c) = 0;
  *(undefined4 *)(ppfVar26 + 6) = 0;
  *(undefined4 *)((long)ppfVar26 + 0x34) = 0;
  *(undefined4 *)(ppfVar26 + 7) = 0;
  ppfVar26[8] = (float *)0x0;
  ppfVar26[1] = (float *)0x0;
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0] * a0 + S1p[1] * a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0] * a0 + S0p[1] * a1;
                rows1p[dx] = S1p[0] * a0 + S1p[1] * a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);
        for (int dx = 0; dx < w; dx++)
        {
            //             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }
}